

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int condSect2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x19) {
    iVar1 = 0x33;
    pcVar2 = externalSubset1;
  }
  else {
    iVar1 = -1;
    pcVar2 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int condSect2(PROLOG_STATE *state,
              int tok,
              const char *ptr,
              const char *end,
              const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_OPEN_BRACKET:
    state->handler = externalSubset1;
    return XML_ROLE_IGNORE_SECT;
  }
  return common(state, tok);
}